

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_bigint64.c
# Opt level: O0

int main(void)

{
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    _PDCLIB_bigint_t big;
    uint_least32_t value;
    unsigned n;

    for ( n = 0; n < 32; ++n )
    {
        value = UINT32_C( 1 ) << n;
        _PDCLIB_bigint64( &big, 0, value );
        TESTCASE( big.size == n / _PDCLIB_BIGINT_DIGIT_BITS + 1 );
        _PDCLIB_bigint64( &big, value, 0 );
        TESTCASE( big.size == n / _PDCLIB_BIGINT_DIGIT_BITS + DIGITS_PER_32BIT + 1 );
    }
#endif

    return TEST_RESULTS;
}